

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::CountOnesFunction::CountOnesFunction(CountOnesFunction *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,CountOnes,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b1500;
  return;
}

Assistant:

CountOnesFunction() : SystemSubroutine(KnownSystemName::CountOnes, SubroutineKind::Function) {}